

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O2

void __thiscall MonahanPlanner::Plan(MonahanPlanner *this)

{
  QFunctionsDiscreteNonStationary *Q_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_t sVar1;
  pointer pvVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  reference pvVar8;
  ostream *poVar9;
  PlanningUnitDecPOMDPDiscrete *pPVar10;
  StateDistribution *belief;
  MonahanPlanner *pMVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  QFunctionsDiscrete Qs;
  QFunctionsDiscrete Q;
  ValueFunctionPOMDPDiscrete immR;
  ValueFunctionPOMDPDiscrete Q0;
  string local_78 [32];
  AlphaVector alpha;
  
  if (this->_m_initialized == false) {
    (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[3])(this);
  }
  if (this->_m_alreadyComputed == false) {
    this->_m_alreadyComputed = true;
    pPVar10 = (this->super_AlphaVectorPlanning)._m_pu;
    if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar10 = (this->super_AlphaVectorPlanning)._m_puShared.px;
    }
    sVar1 = (pPVar10->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
    uVar6 = (**(code **)((long)*(pPVar10->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
    pPVar10 = (this->super_AlphaVectorPlanning)._m_pu;
    if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar10 = (this->super_AlphaVectorPlanning)._m_puShared.px;
    }
    sVar7 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar10->super_PlanningUnitMADPDiscrete);
    Q.
    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar12 = (int)sVar1;
    Q.
    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Q.
    super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
              *)&alpha,(long)iVar12,(allocator_type *)&Qs);
    Q_00 = &this->_m_qFunction;
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::_M_move_assign(Q_00,&alpha);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               *)&alpha);
    AlphaVector::AlphaVector(&alpha,(long)(int)sVar7);
    Q0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    Q0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    Q0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    AlphaVectorPlanning::GetImmediateRewardValueFunction(&immR,&this->super_AlphaVectorPlanning);
    uVar13 = iVar12 - 1;
    this_00 = &this->_m_maxNrAlphas;
    pMVar11 = (MonahanPlanner *)this_00;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (this_00,(long)(int)uVar13);
    CheckMaxNrVectors(pMVar11,*pvVar8,
                      ((long)immR.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)immR.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x28);
    lVar14 = (uVar6 & 0xffffffff) * 0x18;
    uVar5 = uVar13;
    while( true ) {
      *(uint *)&(this->super_AlphaVectorPlanning).field_0x12c = uVar5;
      if ((int)uVar5 < 0) break;
      if (uVar5 == uVar13) {
        AlphaVectorPlanning::ValueFunctionToQ(&Qs,&this->super_AlphaVectorPlanning,&immR);
        for (lVar15 = 0; lVar14 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::push_back((Q_00->
                      super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (int)uVar13,
                      (value_type *)
                      ((long)&((Qs.
                                super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl
                              .super__Vector_impl_data._M_start + lVar15));
        }
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector(&Qs);
      }
      else {
        pvVar2 = (Q_00->
                 super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                           (this_00,(ulong)uVar5);
        (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[2])
                  (&Qs,this,pvVar2 + (ulong)uVar5 + 1,*pvVar8);
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::_M_move_assign(&Q,&Qs);
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector(&Qs);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                           (this_00,(long)*(int *)&(this->super_AlphaVectorPlanning).field_0x12c);
        sVar1 = *pvVar8;
        pMVar11 = this;
        sVar7 = GetNrVectors(this);
        CheckMaxNrVectors(pMVar11,sVar1,sVar7);
        for (lVar15 = 0; lVar14 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::push_back((this->_m_qFunction).
                      super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      *(int *)&(this->super_AlphaVectorPlanning).field_0x12c,
                      (value_type *)
                      ((long)&((Q.
                                super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl
                              .super__Vector_impl_data._M_start + lVar15));
        }
      }
      (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[6])
                ((string *)&Qs,this);
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&Qs);
      poVar9 = std::operator<<(poVar9,"Planner: t ");
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,*(int *)&(this->super_AlphaVectorPlanning).field_0x12c);
      std::operator<<(poVar9," contains <");
      std::__cxx11::string::~string((string *)&Qs);
      for (lVar15 = 0; lVar14 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
        poVar9 = std::operator<<((ostream *)&std::cout," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      }
      poVar9 = std::operator<<((ostream *)&std::cout," > vectors (total ");
      GetNrVectors(this);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,")");
      std::endl<char,std::char_traits<char>>(poVar9);
      uVar5 = *(int *)&(this->super_AlphaVectorPlanning).field_0x12c - 1;
    }
    bVar4 = std::operator!=(&this->_m_resultsFilename,"");
    if (bVar4) {
      AlphaVectorPlanning::ExportValueFunction(&this->_m_resultsFilename,Q_00,true);
    }
    (*(this->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[6])(local_78,this)
    ;
    poVar9 = std::operator<<((ostream *)&std::cout,local_78);
    poVar9 = std::operator<<(poVar9,"Planner[h=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::operator<<(poVar9,"]: Vjb0=");
    pPVar10 = (this->super_AlphaVectorPlanning)._m_pu;
    if (pPVar10 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar10 = (this->super_AlphaVectorPlanning)._m_puShared.px;
    }
    pDVar3 = pPVar10->_m_DecPOMDP;
    belief = (StateDistribution *)
             (**(code **)(*(long *)((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8)) +
                         0x50))((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8));
    ::Belief::Belief((Belief *)&Qs,belief);
    dVar16 = BeliefValue::GetValue
                       ((BeliefInterface *)
                        ((long)&(Qs.
                                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-8].
                                 super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                                 _M_impl.super__Vector_impl_data._M_finish)->_m_action +
                        (long)&((Belief *)&Qs)->field_0x0),
                        (Q_00->
                        super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    poVar9 = std::ostream::_M_insert<double>(dVar16);
    std::endl<char,std::char_traits<char>>(poVar9);
    ::Belief::~Belief((Belief *)&Qs);
    std::__cxx11::string::~string(local_78);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&immR);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&Q0);
    AlphaVector::~AlphaVector(&alpha);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector(&Q);
  }
  return;
}

Assistant:

void MonahanPlanner::Plan()
{
    if(!MonahanPlanner::_m_initialized)
        Initialize();
    if(_m_alreadyComputed)
        return;
    _m_alreadyComputed=true;

    int h=GetPU()->GetHorizon(),nrA=GetPU()->GetNrJointActions(),
        nrS=GetPU()->GetNrStates();
    QFunctionsDiscrete Q;

    _m_qFunction=vector<QFunctionsDiscrete>(h);

    AlphaVector alpha(nrS);
    ValueFunctionPOMDPDiscrete Q0;

    ValueFunctionPOMDPDiscrete immR=GetImmediateRewardValueFunction();
    CheckMaxNrVectors(_m_maxNrAlphas.at(h-1),immR.size());

    _m_timeStep=h-1;
    while(_m_timeStep>=0)
    {
        if(_m_timeStep==h-1) // last time step, copy in immediate reward function
        {
            QFunctionsDiscrete Qs=ValueFunctionToQ(immR);
            for(int a=0;a!=nrA;a++)
                _m_qFunction[h-1].push_back(Qs[a]);
        }
        else
        {
            Q=BackupStage(_m_qFunction[_m_timeStep+1],_m_maxNrAlphas.at(_m_timeStep));

            CheckMaxNrVectors(_m_maxNrAlphas.at(_m_timeStep),GetNrVectors());
            for(int a=0;a!=nrA;a++)
                _m_qFunction[_m_timeStep].push_back(Q[a]);
        }

        cout << SoftPrintBrief() << "Planner: t " << _m_timeStep << " contains <";
        for(int a=0;a!=nrA;a++)
            cout << " " << _m_qFunction[_m_timeStep][a].size();
        cout << " > vectors (total "
             << GetNrVectors() << ")" << endl;
        _m_timeStep--;
    }

    if(_m_resultsFilename!="")
        ExportValueFunction(_m_resultsFilename,_m_qFunction);

    cout << SoftPrintBrief() << "Planner[h=" 
         << GetPU()->GetHorizon() << "]: Vjb0="
         << BeliefValue::GetValue(Belief(*GetPU()->GetDPOMDPD()->GetISD()),
                                  _m_qFunction[0])
         << endl;
}